

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

void __thiscall
toml::internal_error::internal_error(internal_error *this,string *what_arg,source_location *loc)

{
  pointer pcVar1;
  
  exception::exception(&this->super_exception,loc);
  *(undefined ***)&this->super_exception = &PTR__internal_error_001da058;
  (this->what_)._M_dataplus._M_p = (pointer)&(this->what_).field_2;
  pcVar1 = (what_arg->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->what_,pcVar1,pcVar1 + what_arg->_M_string_length);
  return;
}

Assistant:

explicit internal_error(const std::string& what_arg, const source_location& loc)
        : exception(loc), what_(what_arg)
    {}